

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetc.c
# Opt level: O0

int fgetc(FILE *__stream)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  uint local_1c;
  int local_18;
  uint local_14;
  int rc;
  _PDCLIB_file_t *stream_local;
  
  local_14 = 0xffffffff;
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar3 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
  if (iVar3 != -1) {
    if ((__stream->_IO_read_base == __stream->_IO_write_base) &&
       (__stream->_IO_buf_base == (char *)0x0)) {
      local_18 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
    }
    else {
      local_18 = 0;
    }
    if (local_18 != -1) {
      if (__stream->_IO_buf_base == (char *)0x0) {
        pcVar2 = __stream->_IO_read_base;
        __stream->_IO_read_base = pcVar2 + 1;
        bVar1 = __stream->_IO_read_ptr[(long)pcVar2];
      }
      else {
        pcVar2 = __stream->_IO_buf_base;
        __stream->_IO_buf_base = pcVar2 + -1;
        bVar1 = ((undefined1 *)((long)&__stream->_IO_buf_base + 7))[(long)pcVar2];
      }
      local_1c = (uint)bVar1;
      local_14 = local_1c;
    }
  }
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return local_14;
}

Assistant:

int fgetc( struct _PDCLIB_file_t * stream )
{
    int rc = EOF;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        if ( _PDCLIB_CHECKBUFFER( stream ) != EOF )
        {
            rc = _PDCLIB_GETC( stream );
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return rc;
}